

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O1

int nn_bipc_create(void *hint,nn_epbase **epbase)

{
  nn_usock *self;
  nn_ctx **self_00;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int iVar1;
  int extraout_EAX_05;
  uint uVar2;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  nn_aipc *pnVar3;
  nn_ctx *ctx;
  ulong extraout_RAX;
  nn_list_item *pnVar4;
  nn_list_item *pnVar5;
  char *__s;
  size_t sVar6;
  nn_aipc *in_RCX;
  uint *puVar7;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar8;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  nn_epbase **ppnVar9;
  nn_bipc *pnVar10;
  nn_fsm *pnVar11;
  nn_fsm *pnVar12;
  nn_aipc *unaff_R14;
  nn_aipc *unaff_R15;
  int reconnect_ivl_max;
  int reconnect_ivl;
  size_t sz;
  sockaddr sStack_120;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  nn_fsm *pnStack_98;
  nn_fsm *pnStack_90;
  nn_aipc *pnStack_88;
  code *pcStack_80;
  nn_bipc *pnStack_78;
  nn_fsm_fn *pp_Stack_70;
  nn_aipc *pnStack_68;
  nn_aipc *pnStack_60;
  undefined1 local_30 [8];
  nn_fsm_fn local_28;
  
  pnVar10 = (nn_bipc *)0x3f0;
  ppnVar9 = epbase;
  pnVar3 = (nn_aipc *)nn_alloc_(0x3f0);
  iVar1 = (int)ppnVar9;
  if (pnVar3 == (nn_aipc *)0x0) {
    nn_bipc_create_cold_3();
LAB_0012a9bf:
    nn_bipc_create_cold_1();
  }
  else {
    unaff_R15 = (nn_aipc *)&pnVar3->epbase;
    nn_epbase_init((nn_epbase *)unaff_R15,&nn_bipc_epbase_vfptr,hint);
    ctx = nn_epbase_getctx((nn_epbase *)unaff_R15);
    nn_fsm_init_root((nn_fsm *)pnVar3,nn_bipc_handler,nn_bipc_shutdown,ctx);
    pnVar3->state = 1;
    hint = &local_28;
    local_28 = (nn_fsm_fn)0x4;
    in_RCX = (nn_aipc *)(local_30 + 4);
    iVar1 = 0;
    pnVar10 = (nn_bipc *)unaff_R15;
    nn_epbase_getopt((nn_epbase *)unaff_R15,0,6,in_RCX,(size_t *)hint);
    unaff_R14 = pnVar3;
    if (local_28 != (nn_fsm_fn)0x4) goto LAB_0012a9bf;
    hint = &local_28;
    local_28 = (nn_fsm_fn)0x4;
    in_RCX = (nn_aipc *)local_30;
    iVar1 = 0;
    pnVar10 = (nn_bipc *)unaff_R15;
    nn_epbase_getopt((nn_epbase *)unaff_R15,0,7,in_RCX,(size_t *)hint);
    if (local_28 == (nn_fsm_fn)0x4) {
      if (local_30._0_4_ == 0) {
        local_30._0_4_ = local_30._4_4_;
      }
      nn_backoff_init((nn_backoff *)&(pnVar3->sipc).fsm.shutdown_fn,3,local_30._4_4_,local_30._0_4_,
                      (nn_fsm *)pnVar3);
      nn_usock_init((nn_usock *)&(pnVar3->usock).fsm.shutdown_fn,1,(nn_fsm *)pnVar3);
      *(undefined8 *)&pnVar3->listener_owner = 0;
      nn_list_init((nn_list *)&(pnVar3->listener_owner).fsm);
      nn_fsm_start((nn_fsm *)pnVar3);
      *epbase = (nn_epbase *)unaff_R15;
      return 0;
    }
  }
  nn_bipc_create_cold_2();
  uVar2 = pnVar10->state - 1;
  puVar7 = (uint *)in_RCX;
  if (uVar2 < 9) {
    puVar7 = &switchD_0012a9f1::switchdataD_00134fa4;
    unaff_R14 = in_RCX;
    uVar8 = extraout_EDX;
    switch(pnVar10->state) {
    case 1:
      if (iVar1 == -2) {
        if (extraout_EDX == 0xfffffffe) goto LAB_0012aa1a;
        nn_bipc_handler_cold_11();
        uVar8 = extraout_EDX_00;
        goto switchD_0012a9f1_caseD_9;
      }
LAB_0012ab47:
      nn_bipc_handler_cold_10();
      break;
    case 2:
      unaff_R15 = pnVar10->aipc;
      if (unaff_R15 == in_RCX) {
        uVar2 = extraout_EDX;
        if (extraout_EDX == 0x85b7) {
          pnVar4 = nn_list_end(&pnVar10->aipcs);
          nn_list_insert(&pnVar10->aipcs,&unaff_R15->item,pnVar4);
          pnVar10->aipc = (nn_aipc *)0x0;
          nn_bipc_start_accepting(pnVar10);
          return extraout_EAX_03;
        }
        goto LAB_0012ab6a;
      }
      if (iVar1 != 2) {
        nn_bipc_handler_cold_7();
        goto LAB_0012ab2c;
      }
      if (extraout_EDX == 0x85b9) {
        nn_list_erase(&pnVar10->aipcs,&in_RCX->item);
        nn_aipc_term(in_RCX);
        nn_free(in_RCX);
        return extraout_EAX_04;
      }
      uVar2 = 2;
      if (extraout_EDX == 0x85b8) {
        nn_aipc_stop(in_RCX);
        return extraout_EAX_02;
      }
      goto LAB_0012ab73;
    default:
      goto switchD_0012a9f1_caseD_3;
    case 7:
      if (iVar1 != 3) goto LAB_0012ab35;
      if (extraout_EDX == 1) {
        nn_backoff_stop(&pnVar10->retry);
        pnVar10->state = 9;
        return extraout_EAX_00;
      }
      goto LAB_0012ab57;
    case 8:
      if (iVar1 != 1) goto LAB_0012ab3e;
      if (extraout_EDX == 8) {
        return (&switchD_0012a9f1::switchdataD_00134fa4)[uVar2] + 0x134fa4;
      }
      if (extraout_EDX == 7) {
        nn_backoff_start(&pnVar10->retry);
        pnVar10->state = 7;
        return extraout_EAX_01;
      }
      goto LAB_0012ab63;
    case 9:
switchD_0012a9f1_caseD_9:
      if (iVar1 != 3) {
LAB_0012ab2c:
        nn_bipc_handler_cold_1();
LAB_0012ab35:
        nn_bipc_handler_cold_3();
LAB_0012ab3e:
        nn_bipc_handler_cold_5();
        goto LAB_0012ab47;
      }
      if (uVar8 == 2) {
LAB_0012aa1a:
        nn_bipc_start_listening(pnVar10);
        return extraout_EAX;
      }
    }
    nn_bipc_handler_cold_2();
LAB_0012ab57:
    nn_bipc_handler_cold_4();
  }
switchD_0012a9f1_caseD_3:
  nn_bipc_handler_cold_12();
  in_RCX = unaff_R14;
LAB_0012ab63:
  nn_bipc_handler_cold_6();
  uVar2 = extraout_EDX_01;
LAB_0012ab6a:
  nn_bipc_handler_cold_9();
  uVar8 = extraout_EDX_02;
LAB_0012ab73:
  pnVar11 = (nn_fsm *)(ulong)uVar2;
  nn_bipc_handler_cold_8();
  pnStack_78 = pnVar10;
  pp_Stack_70 = (nn_fsm_fn *)hint;
  pnStack_68 = in_RCX;
  pnStack_60 = unaff_R15;
  if (extraout_EDX_03 == 0xfffffffd && uVar8 == 0xfffffffe) goto LAB_0012abc2;
  while( true ) {
    pnVar12 = pnVar11 + 1;
    if (*(int *)&pnVar11[1].fn == 3) {
      pcStack_80 = (code *)0x12abd7;
      nn_bipc_shutdown_cold_2();
      if ((extraout_RAX & 1) != 0) {
        return (int)extraout_RAX;
      }
    }
    uVar2 = *(uint *)&pnVar12->fn;
    pnVar10 = (nn_bipc *)(ulong)uVar2;
    if (uVar2 == 4) {
      pcStack_80 = (code *)0x12abe9;
      iVar1 = nn_usock_isidle((nn_usock *)&pnVar11[1].srcptr);
      if (iVar1 == 0) {
        return 0;
      }
      pcStack_80 = (code *)0x12abfd;
      iVar1 = nn_backoff_isidle((nn_backoff *)&pnVar11[8].stopped.src);
      if (iVar1 == 0) {
        return 0;
      }
      self_00 = &pnVar11[8].ctx;
      pcStack_80 = (code *)0x12ac14;
      pnVar4 = nn_list_begin((nn_list *)self_00);
      while( true ) {
        pcStack_80 = (code *)0x12ac1f;
        pnVar5 = nn_list_end((nn_list *)self_00);
        if (pnVar4 == pnVar5) break;
        pnVar3 = (nn_aipc *)(pnVar4 + -0x73);
        if (pnVar4 == (nn_list_item *)0x0) {
          pnVar3 = (nn_aipc *)0x0;
        }
        pcStack_80 = (code *)0x12ac38;
        nn_aipc_stop(pnVar3);
        pcStack_80 = (code *)0x12ac43;
        pnVar4 = nn_list_next((nn_list *)self_00,pnVar4);
      }
      *(undefined4 *)&pnVar12->fn = 5;
      goto LAB_0012ac7f;
    }
    if (uVar2 == 5) break;
    pcStack_80 = (code *)0x12abc2;
    nn_bipc_shutdown_cold_4();
LAB_0012abc2:
    pcStack_80 = (code *)0x12abca;
    nn_bipc_shutdown_cold_1();
  }
  if ((uVar8 == 2) && (extraout_EDX_03 == 0x85b9)) {
    pcStack_80 = (code *)0x12ac66;
    nn_list_erase((nn_list *)&pnVar11[8].ctx,&((nn_aipc *)puVar7)->item);
    pcStack_80 = (code *)0x12ac6e;
    nn_aipc_term((nn_aipc *)puVar7);
    pcStack_80 = (code *)0x12ac76;
    nn_free(puVar7);
LAB_0012ac7f:
    pcStack_80 = (code *)0x12ac8b;
    iVar1 = nn_list_empty((nn_list *)&pnVar11[8].ctx);
    if (iVar1 == 0) {
      return 0;
    }
    *(undefined4 *)&pnVar11[1].fn = 1;
    pcStack_80 = (code *)0x12ac9e;
    nn_fsm_stopped_noevent(pnVar11);
    nn_epbase_stopped((nn_epbase *)&pnVar11[1].shutdown_fn);
    return extraout_EAX_05;
  }
  pcStack_80 = nn_bipc_start_listening;
  nn_bipc_shutdown_cold_3();
  pnStack_98 = pnVar11;
  pnStack_90 = pnVar12;
  pnStack_88 = (nn_aipc *)puVar7;
  pcStack_80 = (code *)(ulong)extraout_EDX_03;
  __s = nn_epbase_getaddr(&pnVar10->epbase);
  sStack_120.sa_family = 0;
  sStack_120.sa_data[0] = '\0';
  sStack_120.sa_data[1] = '\0';
  sStack_120.sa_data[2] = '\0';
  sStack_120.sa_data[3] = '\0';
  sStack_120.sa_data[4] = '\0';
  sStack_120.sa_data[5] = '\0';
  sStack_120.sa_data[6] = '\0';
  sStack_120.sa_data[7] = '\0';
  sStack_120.sa_data[8] = '\0';
  sStack_120.sa_data[9] = '\0';
  sStack_120.sa_data[10] = '\0';
  sStack_120.sa_data[0xb] = '\0';
  sStack_120.sa_data[0xc] = '\0';
  sStack_120.sa_data[0xd] = '\0';
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  sVar6 = strlen(__s);
  if (0x6b < sVar6) {
    nn_bipc_start_listening_cold_4();
    goto LAB_0012ae2b;
  }
  sStack_120.sa_family = 1;
  strncpy(sStack_120.sa_data,__s,0x6c);
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
LAB_0012adb7:
    self = &pnVar10->usock;
    iVar1 = nn_usock_start(self,1,1,0);
    if (-1 < iVar1) {
      iVar1 = nn_usock_bind(self,&sStack_120,0x6e);
      if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self,10), -1 < iVar1)) {
        nn_bipc_start_accepting(pnVar10);
        pnVar10->state = 2;
        return extraout_EAX_06;
      }
      nn_usock_stop(self);
      pnVar10->state = 8;
      return extraout_EAX_07;
    }
LAB_0012ae2b:
    nn_backoff_start(&pnVar10->retry);
    pnVar10->state = 7;
    return extraout_EAX_08;
  }
  iVar1 = fcntl(uVar2,4,0x800);
  if (iVar1 == -1) {
    puVar7 = (uint *)__errno_location();
    pnVar11 = (nn_fsm *)(ulong)*puVar7;
    if (*puVar7 == 0x16) goto LAB_0012ad6f;
  }
  else {
LAB_0012ad6f:
    iVar1 = connect(uVar2,(sockaddr *)&sStack_120,0x6e);
    if ((((iVar1 == -1) && (puVar7 = (uint *)__errno_location(), *puVar7 == 0x6f)) &&
        (iVar1 = unlink(__s), iVar1 != 0)) && (pnVar11 = (nn_fsm *)(ulong)*puVar7, *puVar7 != 2))
    goto LAB_0012ae4d;
    pnVar11 = (nn_fsm *)(ulong)uVar2;
    iVar1 = close(uVar2);
    if (iVar1 == 0) goto LAB_0012adb7;
    nn_bipc_start_listening_cold_3();
  }
  nn_bipc_start_listening_cold_1();
LAB_0012ae4d:
  nn_bipc_start_listening_cold_2();
  if (pnVar11[8].owner == (nn_fsm *)0x0) {
    pnVar12 = (nn_fsm *)0x740;
    pnVar3 = (nn_aipc *)nn_alloc_(0x740);
    pnVar11[8].owner = (nn_fsm *)pnVar3;
    if (pnVar3 != (nn_aipc *)0x0) {
      nn_aipc_init(pnVar3,2,(nn_epbase *)&pnVar11[1].shutdown_fn,pnVar11);
      nn_aipc_start((nn_aipc *)pnVar11[8].owner,(nn_usock *)&pnVar11[1].srcptr);
      return extraout_EAX_09;
    }
  }
  else {
    nn_bipc_start_accepting_cold_1();
    pnVar12 = pnVar11;
  }
  nn_bipc_start_accepting_cold_2();
  if (pnVar12 != (nn_fsm *)0x0) {
    pnVar12 = (nn_fsm *)&pnVar12[-2].stopped.item;
  }
  nn_fsm_stop(pnVar12);
  return extraout_EAX_10;
}

Assistant:

int nn_bipc_create (void *hint, struct nn_epbase **epbase)
{
    struct nn_bipc *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_bipc), "bipc");
    alloc_assert (self);

    /*  Initialise the structure. */
    nn_epbase_init (&self->epbase, &nn_bipc_epbase_vfptr, hint);
    nn_fsm_init_root (&self->fsm, nn_bipc_handler, nn_bipc_shutdown,
        nn_epbase_getctx (&self->epbase));
    self->state = NN_BIPC_STATE_IDLE;
    sz = sizeof (reconnect_ivl);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL,
        &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_BIPC_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);
    nn_usock_init (&self->usock, NN_BIPC_SRC_USOCK, &self->fsm);
    self->aipc = NULL;
    nn_list_init (&self->aipcs);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Return the base class as an out parameter. */
    *epbase = &self->epbase;

    return 0;
}